

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deadline_timer.cpp
# Opt level: O3

io_service * __thiscall booster::aio::deadline_timer::get_io_service(deadline_timer *this)

{
  system_error *this_00;
  
  if (this->srv_ != (io_service *)0x0) {
    return this->srv_;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x40);
  system::system_error::system_error(this_00,5,aio_error_cat);
  __cxa_throw(this_00,&system::system_error::typeinfo,system::system_error::~system_error);
}

Assistant:

io_service &deadline_timer::get_io_service()
{
	if(!srv_)
		throw system::system_error(aio_error::no_service_provided,aio_error_cat);
	return *srv_;
}